

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

void __thiscall
ON_PostEffects::GetPostEffects(ON_PostEffects *this,Types type,ON_SimpleArray<ON_PostEffect_*> *a)

{
  int iVar1;
  int iVar2;
  Types TVar3;
  ON_PostEffect **ppOVar4;
  ON_PostEffect *local_38;
  ON_PostEffect *pep;
  ON_SimpleArray<ON_PostEffect_*> *pOStack_28;
  int i;
  ON_SimpleArray<ON_PostEffect_*> *pel;
  ON_SimpleArray<ON_PostEffect_*> *a_local;
  ON_PostEffects *pOStack_10;
  Types type_local;
  ON_PostEffects *this_local;
  
  pel = a;
  a_local._4_4_ = type;
  pOStack_10 = this;
  pOStack_28 = CImpl::PostEffectList(this->_impl);
  pep._4_4_ = 0;
  while( true ) {
    iVar1 = pep._4_4_;
    iVar2 = ON_SimpleArray<ON_PostEffect_*>::Count(pOStack_28);
    if (iVar2 <= iVar1) break;
    ppOVar4 = ON_SimpleArray<ON_PostEffect_*>::operator[](pOStack_28,pep._4_4_);
    local_38 = *ppOVar4;
    TVar3 = (*local_38->_vptr_ON_PostEffect[5])();
    if (TVar3 == a_local._4_4_) {
      ON_SimpleArray<ON_PostEffect_*>::Append(pel,&local_38);
    }
    pep._4_4_ = pep._4_4_ + 1;
  }
  return;
}

Assistant:

void ON_PostEffects::GetPostEffects(ON_PostEffect::Types type, ON_SimpleArray<ON_PostEffect*>& a)
{
  const auto& pel = _impl->PostEffectList();

  for (int i = 0; i < pel.Count(); i++)
  {
    ON_PostEffect* pep = pel[i];
    if (pep->Type() == type)
      a.Append(pep);
  }
}